

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O3

void __thiscall QLocalSocketPrivate::cancelDelayedConnect(QLocalSocketPrivate *this)

{
  if (this->delayConnect != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled(SUB81(this->delayConnect,0));
    if (this->delayConnect != (QSocketNotifier *)0x0) {
      (**(code **)(*(long *)this->delayConnect + 0x20))();
    }
    this->delayConnect = (QSocketNotifier *)0x0;
    QTimer::stop();
    if (this->connectTimer != (QTimer *)0x0) {
      (**(code **)(*(long *)this->connectTimer + 0x20))();
    }
    this->connectTimer = (QTimer *)0x0;
  }
  return;
}

Assistant:

void QLocalSocketPrivate::cancelDelayedConnect()
{
    if (delayConnect) {
        delayConnect->setEnabled(false);
        delete delayConnect;
        delayConnect = nullptr;
        connectTimer->stop();
        delete connectTimer;
        connectTimer = nullptr;
    }
}